

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::GenPackForScalarVectorField
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_prefix_ptr,
          string *code_ptr)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  long *plVar8;
  string field_field;
  string struct_type;
  string field_method;
  long *local_180;
  long local_170;
  long lStack_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  FieldDef *local_c0;
  StructDef *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_100,pIVar1);
  local_c0 = field;
  (*(this->namer_).super_Namer._vptr_Namer[4])(local_70,pIVar1,field);
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(local_90,pIVar1,struct_def);
  GenIndents_abi_cxx11_(&local_120,this,2);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_140.field_2._M_allocated_capacity = *psVar7;
    local_140.field_2._8_8_ = plVar5[3];
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar7;
    local_140._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_b8 = struct_def;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
  paVar2 = &local_160.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160.field_2._8_8_ = plVar5[3];
    local_160._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_170 = *plVar8;
    lStack_168 = plVar5[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar8;
    local_180 = (long *)*plVar5;
  }
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  GenIndents_abi_cxx11_(&local_50,this,3);
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90[0]);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_e0.field_2._M_allocated_capacity = *psVar7;
    local_e0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar7;
    local_e0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_e0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_70[0]);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_120.field_2._M_allocated_capacity = *psVar7;
    local_120.field_2._8_8_ = plVar5[3];
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar7;
    local_120._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_120._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_140.field_2._M_allocated_capacity = *psVar7;
    local_140.field_2._8_8_ = plVar5[3];
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar7;
    local_140._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160.field_2._8_8_ = plVar5[3];
    local_160._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_170 = *plVar8;
    lStack_168 = plVar5[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar8;
    local_180 = (long *)*plVar5;
  }
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_180);
  paVar3 = &local_120.field_2;
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  paVar4 = &local_140.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  GenIndents_abi_cxx11_(&local_120,this,2);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_140.field_2._M_allocated_capacity = *psVar7;
    local_140.field_2._8_8_ = plVar5[3];
    local_140._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar7;
    local_140._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160.field_2._8_8_ = plVar5[3];
    local_160._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar7;
    local_160._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_170 = *plVar8;
    lStack_168 = plVar5[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar8;
    local_180 = (long *)*plVar5;
  }
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar4) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((local_c0->value).type.element == BASE_TYPE_STRING) {
    GenIndents_abi_cxx11_(&local_140,this,3);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = plVar5[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar4) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_120,this,3);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140.field_2._8_8_ = plVar5[3];
      local_140._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = plVar5[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar4) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar3) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_e0,this,4);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e0,(ulong)local_100._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120.field_2._8_8_ = plVar5[3];
      local_120._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_120._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140.field_2._8_8_ = plVar5[3];
      local_140._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = plVar5[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar4) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar3) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    GenPackForScalarVectorFieldHelper(this,local_b8,local_c0,code_prefix_ptr,3);
    std::operator+(&local_160,"(",&local_100);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_140,this,3);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = plVar5[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
  }
  else if ((((this->super_BaseGenerator).parser_)->opts).python_gen_numpy == true) {
    GenIndents_abi_cxx11_(&local_120,this,3);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140.field_2._8_8_ = plVar5[3];
      local_140._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = plVar5[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar4) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar3) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_e0,this,4);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e0,(ulong)local_100._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120.field_2._8_8_ = plVar5[3];
      local_120._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_120._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140.field_2._8_8_ = plVar5[3];
      local_140._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = plVar5[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar4) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar3) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_160,this,3);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    GenPackForScalarVectorFieldHelper(this,local_b8,local_c0,code_prefix_ptr,4);
    std::operator+(&local_160,"(self.",&local_100);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_140,this,4);
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
    psVar7 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = puVar6[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_160._M_string_length = puVar6[1];
    *puVar6 = psVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
  }
  else {
    GenPackForScalarVectorFieldHelper(this,local_b8,local_c0,code_prefix_ptr,3);
    std::operator+(&local_160,"(self.",&local_100);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_140,this,4);
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_100._M_dataplus._M_p);
    psVar7 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = puVar6[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_160._M_string_length = puVar6[1];
    *puVar6 = psVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_170 = *plVar8;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar8;
      local_180 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_180);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar4) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenPackForScalarVectorField(const StructDef &struct_def,
                                   const FieldDef &field,
                                   std::string *code_prefix_ptr,
                                   std::string *code_ptr) const {
    auto &code = *code_ptr;
    auto &code_prefix = *code_prefix_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_type = namer_.Type(struct_def);

    // Adds the field into the struct.
    code += GenIndents(2) + "if self." + field_field + " is not None:";
    code += GenIndents(3) + struct_type + "Add" + field_method + "(builder, " +
            field_field + ")";

    // Creates the field.
    code_prefix += GenIndents(2) + "if self." + field_field + " is not None:";
    // If the vector is a string vector, we need to first build accessor for
    // each string element. And this generated code, needs to be
    // placed ahead of code_prefix.
    auto vectortype = field.value.type.VectorType();
    if (IsString(vectortype)) {
      code_prefix += GenIndents(3) + field_field + "list = []";
      code_prefix +=
          GenIndents(3) + "for i in range(len(self." + field_field + ")):";
      code_prefix += GenIndents(4) + field_field +
                     "list.append(builder.CreateString(self." + field_field +
                     "[i]))";
      GenPackForScalarVectorFieldHelper(struct_def, field, code_prefix_ptr, 3);
      code_prefix += "(" + field_field + "list[i])";
      code_prefix += GenIndents(3) + field_field + " = builder.EndVector()";
      return;
    }

    if (parser_.opts.python_gen_numpy) {
      code_prefix += GenIndents(3) + "if np is not None and type(self." +
                    field_field + ") is np.ndarray:";
      code_prefix += GenIndents(4) + field_field +
                    " = builder.CreateNumpyVector(self." + field_field + ")";
      code_prefix += GenIndents(3) + "else:";
      GenPackForScalarVectorFieldHelper(struct_def, field, code_prefix_ptr, 4);
      code_prefix += "(self." + field_field + "[i])";
      code_prefix += GenIndents(4) + field_field + " = builder.EndVector()";
    } else {
      GenPackForScalarVectorFieldHelper(struct_def, field, code_prefix_ptr, 3);
      code_prefix += "(self." + field_field + "[i])";
      code_prefix += GenIndents(4) + field_field + " = builder.EndVector()";
    }
  }